

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_3dm_settings.cpp
# Opt level: O0

bool __thiscall ON_EarthAnchorPoint::Write(ON_EarthAnchorPoint *this,ON_BinaryArchive *file)

{
  bool bVar1;
  EarthCoordinateSystem EVar2;
  double x;
  double x_00;
  ON__INT32 local_3c;
  uint u;
  int earth_basepoint_elevation_zero;
  double earth_longitude;
  double earth_latitude;
  bool rc;
  ON_BinaryArchive *file_local;
  ON_EarthAnchorPoint *this_local;
  
  bVar1 = ON_BinaryArchive::BeginWrite3dmChunk(file,0x40008000,1,2);
  if (bVar1) {
    x = Internal_UnsetToZeroInV5Files(file,this->m_earth_latitude);
    x_00 = Internal_UnsetToZeroInV5Files(file,this->m_earth_longitude);
    earth_latitude._7_1_ = ON_BinaryArchive::WriteDouble(file,x);
    if ((((earth_latitude._7_1_) &&
         (earth_latitude._7_1_ = ON_BinaryArchive::WriteDouble(file,x_00), earth_latitude._7_1_)) &&
        (earth_latitude._7_1_ = ON_BinaryArchive::WriteDouble(file,this->m_earth_elevation_meters),
        earth_latitude._7_1_)) &&
       (((earth_latitude._7_1_ = ON_BinaryArchive::WritePoint(file,&this->m_model_point),
         earth_latitude._7_1_ &&
         (earth_latitude._7_1_ = ON_BinaryArchive::WriteVector(file,&this->m_model_north),
         earth_latitude._7_1_)) &&
        (earth_latitude._7_1_ = ON_BinaryArchive::WriteVector(file,&this->m_model_east),
        earth_latitude._7_1_)))) {
      EVar2 = this->m_earth_coordinate_system;
      if (EVar2 == GroundLevel) {
        local_3c = 0;
      }
      else if (EVar2 == MeanSeaLevel) {
        local_3c = 1;
      }
      else if (EVar2 == CenterOfEarth) {
        local_3c = 2;
      }
      else {
        local_3c = 0;
      }
      earth_latitude._7_1_ = ON_BinaryArchive::WriteInt(file,local_3c);
      if (((earth_latitude._7_1_) &&
          (earth_latitude._7_1_ = ON_BinaryArchive::WriteUuid(file,&this->m_id),
          earth_latitude._7_1_)) &&
         ((earth_latitude._7_1_ = ON_BinaryArchive::WriteString(file,&this->m_name),
          earth_latitude._7_1_ &&
          (((earth_latitude._7_1_ = ON_BinaryArchive::WriteString(file,&this->m_description),
            earth_latitude._7_1_ &&
            (earth_latitude._7_1_ = ON_BinaryArchive::WriteString(file,&this->m_url),
            earth_latitude._7_1_)) &&
           (earth_latitude._7_1_ = ON_BinaryArchive::WriteString(file,&this->m_url_tag),
           earth_latitude._7_1_)))))) {
        EVar2 = EarthCoordinateSystem(&Unset);
        earth_latitude._7_1_ = ON_BinaryArchive::WriteInt(file,(uint)EVar2);
      }
    }
    bVar1 = ON_BinaryArchive::EndWrite3dmChunk(file);
    if (!bVar1) {
      earth_latitude._7_1_ = false;
    }
    this_local._7_1_ = earth_latitude._7_1_;
  }
  else {
    this_local._7_1_ = false;
  }
  return this_local._7_1_;
}

Assistant:

bool ON_EarthAnchorPoint::Write( ON_BinaryArchive& file ) const
{
  bool rc = file.BeginWrite3dmChunk(TCODE_ANONYMOUS_CHUNK,1,2);
  if ( !rc )
    return false;

  for(;;)
  {
    const double earth_latitude = Internal_UnsetToZeroInV5Files(file, m_earth_latitude);
    const double earth_longitude = Internal_UnsetToZeroInV5Files(file, m_earth_longitude);
    rc = file.WriteDouble(earth_latitude);
    if (!rc) break;
    rc = file.WriteDouble(earth_longitude);
    if (!rc) break;
    rc = file.WriteDouble(m_earth_elevation_meters);
    if (!rc) break;
    rc = file.WritePoint(m_model_point);
    if (!rc) break;
    rc = file.WriteVector(m_model_north);
    if (!rc) break;
    rc = file.WriteVector(m_model_east);
    if (!rc) break;

    // 1.1 fields
    int earth_basepoint_elevation_zero;
    switch (m_earth_coordinate_system)
    {
    case ON::EarthCoordinateSystem::GroundLevel:
      earth_basepoint_elevation_zero = 0;
      break;
    case ON::EarthCoordinateSystem::MeanSeaLevel:
      earth_basepoint_elevation_zero = 1;
      break;
    case ON::EarthCoordinateSystem::CenterOfEarth:
      earth_basepoint_elevation_zero = 2;
      break;
    default:
      earth_basepoint_elevation_zero = 0;
      break;
    }
    rc = file.WriteInt(earth_basepoint_elevation_zero); // legacy value for old files
    if (!rc) break;
    rc = file.WriteUuid(m_id);
    if (!rc) break;
    rc = file.WriteString(m_name);
    if (!rc) break;
    rc = file.WriteString(m_description);
    if (!rc) break;
    rc = file.WriteString(m_url);
    if (!rc) break;
    rc = file.WriteString(m_url_tag);
    if (!rc) break;

    // 1.2 fields
    unsigned int u;
    u = static_cast<unsigned char>(ON_EarthAnchorPoint::Unset.EarthCoordinateSystem());
    rc = file.WriteInt(u);
    if (!rc) break;

    break;
  }

  if ( !file.EndWrite3dmChunk() )
    rc = false;

  return rc;
}